

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gim_array.h
# Opt level: O2

bool __thiscall
gim_array<GIM_RSORT_TOKEN>::resizeData(gim_array<GIM_RSORT_TOKEN> *this,uint newsize)

{
  GIM_RSORT_TOKEN *pGVar1;
  
  if (newsize == 0) {
    destroyData(this);
  }
  else {
    if ((ulong)this->m_size == 0) {
      pGVar1 = (GIM_RSORT_TOKEN *)gim_alloc((ulong)newsize << 3);
    }
    else {
      pGVar1 = (GIM_RSORT_TOKEN *)
               gim_realloc(this->m_data,(ulong)this->m_size << 3,(ulong)newsize << 3);
    }
    this->m_data = pGVar1;
    this->m_allocated_size = newsize;
  }
  return true;
}

Assistant:

inline bool resizeData(GUINT newsize)
	{
		if(newsize==0)
		{
			destroyData();
			return true;
		}

		if(m_size>0)
		{
            m_data = (T*)gim_realloc(m_data,m_size*sizeof(T),newsize*sizeof(T));
		}
		else
		{
		    m_data = (T*)gim_alloc(newsize*sizeof(T));
		}
		m_allocated_size = newsize;
		return true;
	}